

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeString(Parser *this,string *output,ErrorMaker error)

{
  bool bVar1;
  Token *pTVar2;
  string *output_local;
  Parser *this_local;
  ErrorMaker error_local;
  
  bVar1 = LookingAtType(this,TYPE_STRING);
  if (bVar1) {
    pTVar2 = io::Tokenizer::current(this->input_);
    io::Tokenizer::ParseString(&pTVar2->text,output);
    io::Tokenizer::Next(this->input_);
    while( true ) {
      bVar1 = LookingAtType(this,TYPE_STRING);
      if (!bVar1) break;
      pTVar2 = io::Tokenizer::current(this->input_);
      io::Tokenizer::ParseStringAppend(&pTVar2->text,output);
      io::Tokenizer::Next(this->input_);
    }
    error_local.func_._7_1_ = true;
  }
  else {
    RecordError(this,error);
    error_local.func_._7_1_ = false;
  }
  return error_local.func_._7_1_;
}

Assistant:

bool Parser::ConsumeString(std::string* output, ErrorMaker error) {
  if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
    io::Tokenizer::ParseString(input_->current().text, output);
    input_->Next();
    // Allow C++ like concatenation of adjacent string tokens.
    while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      io::Tokenizer::ParseStringAppend(input_->current().text, output);
      input_->Next();
    }
    return true;
  } else {
    RecordError(error);
    return false;
  }
}